

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  pointer pcVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  char *pcVar9;
  char *pcVar10;
  
  pcVar1 = (this->_last)._M_current;
  pcVar2 = (this->_iter)._M_current;
  if ((pcVar2 == pcVar1) ||
     ((pcVar3 = (this->_first)._M_current, pcVar2 != pcVar3 &&
      ((pcVar2 + 1 == pcVar1 && pcVar2 != (this->_root)._M_current) && *pcVar2 == '/')))) {
    (this->_current)._path._M_string_length = 0;
    _Var8._M_current = (this->_current)._path._M_dataplus._M_p;
    goto LAB_0011f564;
  }
  pcVar4 = (this->_prefix)._M_current;
  pcVar5 = (this->_iter)._M_current;
  if ((pcVar1 != pcVar5) && (pcVar4 <= pcVar3 || pcVar3 != pcVar5)) {
    pcVar10 = pcVar5 + 1;
    if (*pcVar5 == '/') {
      if ((pcVar10 != pcVar1) && (*pcVar10 == '/')) {
        if ((pcVar3 == pcVar5 || pcVar4 == pcVar5) &&
           ((pcVar9 = pcVar5 + 2, pcVar9 == pcVar1 || (*pcVar9 != '/')))) goto LAB_0011f513;
        do {
          if (*pcVar10 != '/') break;
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 != pcVar1);
      }
    }
    else {
      pcVar9 = pcVar10;
      if ((pcVar3 != pcVar5 && pcVar4 != pcVar5 || pcVar10 == pcVar1) || (*pcVar10 != ':')) {
LAB_0011f513:
        std::
        __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                  (pcVar9,pcVar1,&path_helper_base<char>::preferred_separator);
      }
    }
  }
  std::__cxx11::string::replace
            ((ulong)&this->_current,0,(char *)(this->_current)._path._M_string_length,(ulong)pcVar2)
  ;
  uVar6 = (this->_current)._path._M_string_length;
  if ((((uVar6 < 3) || (pcVar1 = (this->_current)._path._M_dataplus._M_p, *pcVar1 != '/')) ||
      (pcVar1[1] != '/')) || (pcVar1[2] == '/')) {
    pcVar7 = (this->_current)._path._M_dataplus._M_p;
    _Var8 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                      (pcVar7,pcVar7 + uVar6);
  }
  else {
    _Var8 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                      (pcVar1 + 2,pcVar1 + uVar6);
  }
  (this->_current)._path._M_string_length =
       (long)_Var8._M_current - (long)(this->_current)._path._M_dataplus._M_p;
LAB_0011f564:
  *_Var8._M_current = '\0';
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if ((_iter == _last) || (_iter != _first && _iter != _last && (*_iter == preferred_separator && _iter != _root) && (_iter + 1 == _last))) {
        _current.clear();
    }
    else {
        _current.assign(_iter, increment(_iter));
    }
}